

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTests.cpp
# Opt level: O1

void deqp::gles31::Functional::anon_unknown_0::generateProgramInputBlockContents
               (Context *context,SharedPtr *parentStructure,TestCaseGroup *targetGroup,
               deUint32 presentShadersMask,bool includeEmpty,
               _func_void_Context_ptr_SharedPtr_ptr_TestCaseGroup_ptr_ProgramInterface_char_ptr
               *genCase)

{
  deInt32 *pdVar1;
  NodeType NVar2;
  ShaderType SVar3;
  Node *pNVar4;
  Node *pNVar5;
  SharedPtrStateBase *pSVar6;
  SharedPtr variable_1;
  SharedPtr variable;
  SharedPtr variable_2;
  SharedPtr input;
  SharedPtr local_88;
  SharedPtr local_78;
  SharedPtr local_68;
  Node *local_58;
  SharedPtrStateBase *pSStack_50;
  Context *local_48;
  TestCaseGroup *local_40;
  _func_void_Context_ptr_SharedPtr_ptr_TestCaseGroup_ptr_ProgramInterface_char_ptr *local_38;
  
  pNVar5 = parentStructure->m_ptr;
  NVar2 = pNVar5->m_type;
  local_48 = context;
  local_40 = targetGroup;
  local_38 = genCase;
  if (NVar2 == TYPE_DEFAULT_BLOCK) {
    pNVar4 = (Node *)operator_new(0x28);
    pNVar4->_vptr_Node = (_func_int **)&PTR__Node_021b1ef8;
    pNVar4->m_type = TYPE_STORAGE_QUALIFIER;
    (pNVar4->m_enclosingNode).m_ptr = pNVar5;
    pSVar6 = parentStructure->m_state;
    (pNVar4->m_enclosingNode).m_state = pSVar6;
    if (pSVar6 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pSVar6->strongRefCount = pSVar6->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar1 = &((pNVar4->m_enclosingNode).m_state)->weakRefCount;
      *pdVar1 = *pdVar1 + 1;
      UNLOCK();
    }
    pNVar4->_vptr_Node = (_func_int **)&PTR__Node_021b1fc8;
    *(undefined4 *)&pNVar4[1]._vptr_Node = 0;
    pSStack_50 = (SharedPtrStateBase *)0x0;
    local_58 = pNVar4;
    pSStack_50 = (SharedPtrStateBase *)operator_new(0x20);
    pSStack_50->strongRefCount = 0;
    pSStack_50->weakRefCount = 0;
    pSStack_50->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021b1f18;
    pSStack_50[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar4;
    pSStack_50->strongRefCount = 1;
    pSStack_50->weakRefCount = 1;
  }
  else {
    pSStack_50 = parentStructure->m_state;
    local_58 = pNVar5;
    if (pSStack_50 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pSStack_50->strongRefCount = pSStack_50->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pSStack_50->weakRefCount = pSStack_50->weakRefCount + 1;
      UNLOCK();
    }
  }
  SVar3 = getShaderMaskFirstStage(presentShadersMask);
  if (includeEmpty && NVar2 == TYPE_DEFAULT_BLOCK) {
    (*local_38)(local_48,parentStructure,local_40,PROGRAMINTERFACE_PROGRAM_INPUT,"empty");
  }
  if (SVar3 == SHADERTYPE_FRAGMENT) {
LAB_015a5005:
    pNVar5 = (Node *)operator_new(0x28);
    pNVar5->_vptr_Node = (_func_int **)&PTR__Node_021b1ef8;
    pNVar5->m_type = TYPE_VARIABLE;
    (pNVar5->m_enclosingNode).m_ptr = local_58;
    (pNVar5->m_enclosingNode).m_state = pSStack_50;
    if (pSStack_50 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pSStack_50->strongRefCount = pSStack_50->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar1 = &((pNVar5->m_enclosingNode).m_state)->weakRefCount;
      *pdVar1 = *pdVar1 + 1;
      UNLOCK();
    }
    pNVar5->_vptr_Node = (_func_int **)&PTR__Node_021b2070;
    *(undefined4 *)&pNVar5[1]._vptr_Node = 4;
    local_78.m_state = (SharedPtrStateBase *)0x0;
    local_78.m_ptr = pNVar5;
    local_78.m_state = (SharedPtrStateBase *)operator_new(0x20);
    (local_78.m_state)->strongRefCount = 0;
    (local_78.m_state)->weakRefCount = 0;
    (local_78.m_state)->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021b1f18;
    local_78.m_state[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar5;
    (local_78.m_state)->strongRefCount = 1;
    (local_78.m_state)->weakRefCount = 1;
    (*local_38)(local_48,&local_78,local_40,PROGRAMINTERFACE_PROGRAM_INPUT,"var");
    if (local_78.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar1 = &(local_78.m_state)->strongRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        local_78.m_ptr = (Node *)0x0;
        (*(local_78.m_state)->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar1 = &(local_78.m_state)->weakRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        if (local_78.m_state != (SharedPtrStateBase *)0x0) {
          (*(local_78.m_state)->_vptr_SharedPtrStateBase[1])();
        }
        local_78.m_state = (SharedPtrStateBase *)0x0;
      }
    }
    pNVar5 = (Node *)operator_new(0x20);
    pNVar5->_vptr_Node = (_func_int **)&PTR__Node_021b1ef8;
    pNVar5->m_type = TYPE_STRUCT_MEMBER;
    (pNVar5->m_enclosingNode).m_ptr = local_58;
    (pNVar5->m_enclosingNode).m_state = pSStack_50;
    if (pSStack_50 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pSStack_50->strongRefCount = pSStack_50->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar1 = &((pNVar5->m_enclosingNode).m_state)->weakRefCount;
      *pdVar1 = *pdVar1 + 1;
      UNLOCK();
    }
    pNVar5->_vptr_Node = (_func_int **)&PTR__Node_021b20f8;
    local_78.m_state = (SharedPtrStateBase *)0x0;
    local_78.m_ptr = pNVar5;
    pSVar6 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar6->strongRefCount = 0;
    pSVar6->weakRefCount = 0;
    pSVar6->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021b1f18;
    pSVar6[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar5;
    pSVar6->strongRefCount = 1;
    pSVar6->weakRefCount = 1;
    local_78.m_state = pSVar6;
    pNVar4 = (Node *)operator_new(0x28);
    pNVar4->_vptr_Node = (_func_int **)&PTR__Node_021b1ef8;
    pNVar4->m_type = TYPE_VARIABLE;
    (pNVar4->m_enclosingNode).m_ptr = pNVar5;
    (pNVar4->m_enclosingNode).m_state = pSVar6;
    LOCK();
    pSVar6->strongRefCount = pSVar6->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar1 = &((pNVar4->m_enclosingNode).m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + 1;
    UNLOCK();
    pNVar4->_vptr_Node = (_func_int **)&PTR__Node_021b2070;
    *(undefined4 *)&pNVar4[1]._vptr_Node = 4;
    local_88.m_state = (SharedPtrStateBase *)0x0;
    local_88.m_ptr = pNVar4;
    local_88.m_state = (SharedPtrStateBase *)operator_new(0x20);
    (local_88.m_state)->strongRefCount = 0;
    (local_88.m_state)->weakRefCount = 0;
    (local_88.m_state)->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021b1f18;
    local_88.m_state[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar4;
    (local_88.m_state)->strongRefCount = 1;
    (local_88.m_state)->weakRefCount = 1;
    (*local_38)(local_48,&local_88,local_40,PROGRAMINTERFACE_PROGRAM_INPUT,"var_struct");
    if (local_88.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar1 = &(local_88.m_state)->strongRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        local_88.m_ptr = (Node *)0x0;
        (*(local_88.m_state)->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar1 = &(local_88.m_state)->weakRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        if (local_88.m_state != (SharedPtrStateBase *)0x0) {
          (*(local_88.m_state)->_vptr_SharedPtrStateBase[1])();
        }
        local_88.m_state = (SharedPtrStateBase *)0x0;
      }
    }
    if (local_78.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar1 = &(local_78.m_state)->strongRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        local_78.m_ptr = (Node *)0x0;
        (*(local_78.m_state)->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar1 = &(local_78.m_state)->weakRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        if (local_78.m_state != (SharedPtrStateBase *)0x0) {
          (*(local_78.m_state)->_vptr_SharedPtrStateBase[1])();
        }
        local_78.m_state = (SharedPtrStateBase *)0x0;
      }
    }
    pNVar5 = (Node *)operator_new(0x28);
    pNVar5->_vptr_Node = (_func_int **)&PTR__Node_021b1ef8;
    pNVar5->m_type = TYPE_ARRAY_ELEMENT;
    (pNVar5->m_enclosingNode).m_ptr = local_58;
    (pNVar5->m_enclosingNode).m_state = pSStack_50;
    if (pSStack_50 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pSStack_50->strongRefCount = pSStack_50->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar1 = &((pNVar5->m_enclosingNode).m_state)->weakRefCount;
      *pdVar1 = *pdVar1 + 1;
      UNLOCK();
    }
    pNVar5->_vptr_Node = (_func_int **)&PTR__Node_021b2038;
    *(undefined4 *)&pNVar5[1]._vptr_Node = 0xffffffff;
    local_78.m_state = (SharedPtrStateBase *)0x0;
    local_78.m_ptr = pNVar5;
    pSVar6 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar6->strongRefCount = 0;
    pSVar6->weakRefCount = 0;
    pSVar6->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021b1f18;
    pSVar6[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar5;
    pSVar6->strongRefCount = 1;
    pSVar6->weakRefCount = 1;
    local_78.m_state = pSVar6;
    pNVar4 = (Node *)operator_new(0x28);
    pNVar4->_vptr_Node = (_func_int **)&PTR__Node_021b1ef8;
    pNVar4->m_type = TYPE_VARIABLE;
    (pNVar4->m_enclosingNode).m_ptr = pNVar5;
    (pNVar4->m_enclosingNode).m_state = pSVar6;
    LOCK();
    pSVar6->strongRefCount = pSVar6->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar1 = &((pNVar4->m_enclosingNode).m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + 1;
    UNLOCK();
    pNVar4->_vptr_Node = (_func_int **)&PTR__Node_021b2070;
    *(undefined4 *)&pNVar4[1]._vptr_Node = 4;
    local_88.m_state = (SharedPtrStateBase *)0x0;
    local_88.m_ptr = pNVar4;
    local_88.m_state = (SharedPtrStateBase *)operator_new(0x20);
    (local_88.m_state)->strongRefCount = 0;
    (local_88.m_state)->weakRefCount = 0;
    (local_88.m_state)->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021b1f18;
    local_88.m_state[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar4;
    (local_88.m_state)->strongRefCount = 1;
    (local_88.m_state)->weakRefCount = 1;
    (*local_38)(local_48,&local_88,local_40,PROGRAMINTERFACE_PROGRAM_INPUT,"var_array");
LAB_015a53b0:
    if (local_88.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar1 = &(local_88.m_state)->strongRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        local_88.m_ptr = (Node *)0x0;
        (*(local_88.m_state)->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar1 = &(local_88.m_state)->weakRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        if (local_88.m_state != (SharedPtrStateBase *)0x0) {
          (*(local_88.m_state)->_vptr_SharedPtrStateBase[1])();
        }
        local_88.m_state = (SharedPtrStateBase *)0x0;
      }
    }
  }
  else {
    if (SVar3 != SHADERTYPE_VERTEX) {
      if (NVar2 != TYPE_DEFAULT_BLOCK) goto LAB_015a5005;
      if ((SVar3 & ~SHADERTYPE_FRAGMENT) == SHADERTYPE_GEOMETRY) {
        pNVar5 = (Node *)operator_new(0x28);
        pNVar5->_vptr_Node = (_func_int **)&PTR__Node_021b1ef8;
        pNVar5->m_type = TYPE_ARRAY_ELEMENT;
        (pNVar5->m_enclosingNode).m_ptr = local_58;
        (pNVar5->m_enclosingNode).m_state = pSStack_50;
        if (pSStack_50 != (SharedPtrStateBase *)0x0) {
          LOCK();
          pSStack_50->strongRefCount = pSStack_50->strongRefCount + 1;
          UNLOCK();
          LOCK();
          pdVar1 = &((pNVar5->m_enclosingNode).m_state)->weakRefCount;
          *pdVar1 = *pdVar1 + 1;
          UNLOCK();
        }
        pNVar5->_vptr_Node = (_func_int **)&PTR__Node_021b2038;
        *(undefined4 *)&pNVar5[1]._vptr_Node = 0xfffffffe;
        local_78.m_state = (SharedPtrStateBase *)0x0;
        local_78.m_ptr = pNVar5;
        pSVar6 = (SharedPtrStateBase *)operator_new(0x20);
        pSVar6->strongRefCount = 0;
        pSVar6->weakRefCount = 0;
        pSVar6->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021b1f18;
        pSVar6[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar5;
        pSVar6->strongRefCount = 1;
        pSVar6->weakRefCount = 1;
        local_78.m_state = pSVar6;
        pNVar4 = (Node *)operator_new(0x28);
        pNVar4->_vptr_Node = (_func_int **)&PTR__Node_021b1ef8;
        pNVar4->m_type = TYPE_VARIABLE;
        (pNVar4->m_enclosingNode).m_ptr = pNVar5;
        (pNVar4->m_enclosingNode).m_state = pSVar6;
        LOCK();
        pSVar6->strongRefCount = pSVar6->strongRefCount + 1;
        UNLOCK();
        LOCK();
        pdVar1 = &((pNVar4->m_enclosingNode).m_state)->weakRefCount;
        *pdVar1 = *pdVar1 + 1;
        UNLOCK();
        pNVar4->_vptr_Node = (_func_int **)&PTR__Node_021b2070;
        *(undefined4 *)&pNVar4[1]._vptr_Node = 4;
        local_88.m_state = (SharedPtrStateBase *)0x0;
        local_88.m_ptr = pNVar4;
        local_88.m_state = (SharedPtrStateBase *)operator_new(0x20);
        (local_88.m_state)->strongRefCount = 0;
        (local_88.m_state)->weakRefCount = 0;
        (local_88.m_state)->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021b1f18;
        local_88.m_state[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar4;
        (local_88.m_state)->strongRefCount = 1;
        (local_88.m_state)->weakRefCount = 1;
        (*local_38)(local_48,&local_88,local_40,PROGRAMINTERFACE_PROGRAM_INPUT,"var");
      }
      else {
        if (SVar3 != SHADERTYPE_TESSELLATION_EVALUATION) goto LAB_015a543f;
        pNVar5 = (Node *)operator_new(0x28);
        pNVar5->_vptr_Node = (_func_int **)&PTR__Node_021b1ef8;
        pNVar5->m_type = TYPE_STORAGE_QUALIFIER;
        (pNVar5->m_enclosingNode).m_ptr = parentStructure->m_ptr;
        pSVar6 = parentStructure->m_state;
        (pNVar5->m_enclosingNode).m_state = pSVar6;
        if (pSVar6 != (SharedPtrStateBase *)0x0) {
          LOCK();
          pSVar6->strongRefCount = pSVar6->strongRefCount + 1;
          UNLOCK();
          LOCK();
          pdVar1 = &((pNVar5->m_enclosingNode).m_state)->weakRefCount;
          *pdVar1 = *pdVar1 + 1;
          UNLOCK();
        }
        pNVar5->_vptr_Node = (_func_int **)&PTR__Node_021b1fc8;
        *(undefined4 *)&pNVar5[1]._vptr_Node = 5;
        local_78.m_state = (SharedPtrStateBase *)0x0;
        local_78.m_ptr = pNVar5;
        local_78.m_state = (SharedPtrStateBase *)operator_new(0x20);
        (local_78.m_state)->strongRefCount = 0;
        (local_78.m_state)->weakRefCount = 0;
        (local_78.m_state)->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021b1f18;
        local_78.m_state[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar5;
        (local_78.m_state)->strongRefCount = 1;
        (local_78.m_state)->weakRefCount = 1;
        pNVar5 = (Node *)operator_new(0x28);
        pNVar5->_vptr_Node = (_func_int **)&PTR__Node_021b1ef8;
        pNVar5->m_type = TYPE_ARRAY_ELEMENT;
        (pNVar5->m_enclosingNode).m_ptr = local_58;
        (pNVar5->m_enclosingNode).m_state = pSStack_50;
        if (pSStack_50 != (SharedPtrStateBase *)0x0) {
          LOCK();
          pSStack_50->strongRefCount = pSStack_50->strongRefCount + 1;
          UNLOCK();
          LOCK();
          pdVar1 = &((pNVar5->m_enclosingNode).m_state)->weakRefCount;
          *pdVar1 = *pdVar1 + 1;
          UNLOCK();
        }
        pNVar5->_vptr_Node = (_func_int **)&PTR__Node_021b2038;
        *(undefined4 *)&pNVar5[1]._vptr_Node = 0xfffffffe;
        local_88.m_state = (SharedPtrStateBase *)0x0;
        local_88.m_ptr = pNVar5;
        pSVar6 = (SharedPtrStateBase *)operator_new(0x20);
        pSVar6->strongRefCount = 0;
        pSVar6->weakRefCount = 0;
        pSVar6->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021b1f18;
        pSVar6[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar5;
        pSVar6->strongRefCount = 1;
        pSVar6->weakRefCount = 1;
        local_88.m_state = pSVar6;
        pNVar4 = (Node *)operator_new(0x28);
        pNVar4->_vptr_Node = (_func_int **)&PTR__Node_021b1ef8;
        pNVar4->m_type = TYPE_VARIABLE;
        (pNVar4->m_enclosingNode).m_ptr = pNVar5;
        (pNVar4->m_enclosingNode).m_state = pSVar6;
        LOCK();
        pSVar6->strongRefCount = pSVar6->strongRefCount + 1;
        UNLOCK();
        LOCK();
        pdVar1 = &((pNVar4->m_enclosingNode).m_state)->weakRefCount;
        *pdVar1 = *pdVar1 + 1;
        UNLOCK();
        pNVar4->_vptr_Node = (_func_int **)&PTR__Node_021b2070;
        *(undefined4 *)&pNVar4[1]._vptr_Node = 4;
        local_68.m_state = (SharedPtrStateBase *)0x0;
        local_68.m_ptr = pNVar4;
        local_68.m_state = (SharedPtrStateBase *)operator_new(0x20);
        (local_68.m_state)->strongRefCount = 0;
        (local_68.m_state)->weakRefCount = 0;
        (local_68.m_state)->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021b1f18;
        local_68.m_state[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar4;
        (local_68.m_state)->strongRefCount = 1;
        (local_68.m_state)->weakRefCount = 1;
        (*local_38)(local_48,&local_68,local_40,PROGRAMINTERFACE_PROGRAM_INPUT,"var");
        if (local_68.m_state != (SharedPtrStateBase *)0x0) {
          LOCK();
          pdVar1 = &(local_68.m_state)->strongRefCount;
          *pdVar1 = *pdVar1 + -1;
          UNLOCK();
          if (*pdVar1 == 0) {
            local_68.m_ptr = (Node *)0x0;
            (*(local_68.m_state)->_vptr_SharedPtrStateBase[2])();
          }
          LOCK();
          pdVar1 = &(local_68.m_state)->weakRefCount;
          *pdVar1 = *pdVar1 + -1;
          UNLOCK();
          if (*pdVar1 == 0) {
            if (local_68.m_state != (SharedPtrStateBase *)0x0) {
              (*(local_68.m_state)->_vptr_SharedPtrStateBase[1])();
            }
            local_68.m_state = (SharedPtrStateBase *)0x0;
          }
        }
        if (local_88.m_state != (SharedPtrStateBase *)0x0) {
          LOCK();
          pdVar1 = &(local_88.m_state)->strongRefCount;
          *pdVar1 = *pdVar1 + -1;
          UNLOCK();
          if (*pdVar1 == 0) {
            local_88.m_ptr = (Node *)0x0;
            (*(local_88.m_state)->_vptr_SharedPtrStateBase[2])();
          }
          LOCK();
          pdVar1 = &(local_88.m_state)->weakRefCount;
          *pdVar1 = *pdVar1 + -1;
          UNLOCK();
          if (*pdVar1 == 0) {
            if (local_88.m_state != (SharedPtrStateBase *)0x0) {
              (*(local_88.m_state)->_vptr_SharedPtrStateBase[1])();
            }
            local_88.m_state = (SharedPtrStateBase *)0x0;
          }
        }
        pNVar5 = (Node *)operator_new(0x28);
        pNVar5->_vptr_Node = (_func_int **)&PTR__Node_021b1ef8;
        pNVar5->m_type = TYPE_VARIABLE;
        (pNVar5->m_enclosingNode).m_ptr = local_78.m_ptr;
        (pNVar5->m_enclosingNode).m_state = local_78.m_state;
        if (local_78.m_state != (SharedPtrStateBase *)0x0) {
          LOCK();
          (local_78.m_state)->strongRefCount = (local_78.m_state)->strongRefCount + 1;
          UNLOCK();
          LOCK();
          pdVar1 = &((pNVar5->m_enclosingNode).m_state)->weakRefCount;
          *pdVar1 = *pdVar1 + 1;
          UNLOCK();
        }
        pNVar5->_vptr_Node = (_func_int **)&PTR__Node_021b2070;
        *(undefined4 *)&pNVar5[1]._vptr_Node = 4;
        local_88.m_state = (SharedPtrStateBase *)0x0;
        local_88.m_ptr = pNVar5;
        local_88.m_state = (SharedPtrStateBase *)operator_new(0x20);
        (local_88.m_state)->strongRefCount = 0;
        (local_88.m_state)->weakRefCount = 0;
        (local_88.m_state)->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021b1f18;
        local_88.m_state[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar5;
        (local_88.m_state)->strongRefCount = 1;
        (local_88.m_state)->weakRefCount = 1;
        (*local_38)(local_48,&local_88,local_40,PROGRAMINTERFACE_PROGRAM_INPUT,"patch_var");
        if (local_88.m_state != (SharedPtrStateBase *)0x0) {
          LOCK();
          pdVar1 = &(local_88.m_state)->strongRefCount;
          *pdVar1 = *pdVar1 + -1;
          UNLOCK();
          if (*pdVar1 == 0) {
            local_88.m_ptr = (Node *)0x0;
            (*(local_88.m_state)->_vptr_SharedPtrStateBase[2])();
          }
          LOCK();
          pdVar1 = &(local_88.m_state)->weakRefCount;
          *pdVar1 = *pdVar1 + -1;
          UNLOCK();
          if (*pdVar1 == 0) {
            if (local_88.m_state != (SharedPtrStateBase *)0x0) {
              (*(local_88.m_state)->_vptr_SharedPtrStateBase[1])();
            }
            local_88.m_state = (SharedPtrStateBase *)0x0;
          }
        }
        pNVar5 = (Node *)operator_new(0x20);
        pNVar5->_vptr_Node = (_func_int **)&PTR__Node_021b1ef8;
        pNVar5->m_type = TYPE_STRUCT_MEMBER;
        (pNVar5->m_enclosingNode).m_ptr = local_78.m_ptr;
        (pNVar5->m_enclosingNode).m_state = local_78.m_state;
        if (local_78.m_state != (SharedPtrStateBase *)0x0) {
          LOCK();
          (local_78.m_state)->strongRefCount = (local_78.m_state)->strongRefCount + 1;
          UNLOCK();
          LOCK();
          pdVar1 = &((pNVar5->m_enclosingNode).m_state)->weakRefCount;
          *pdVar1 = *pdVar1 + 1;
          UNLOCK();
        }
        pNVar5->_vptr_Node = (_func_int **)&PTR__Node_021b20f8;
        local_88.m_state = (SharedPtrStateBase *)0x0;
        local_88.m_ptr = pNVar5;
        pSVar6 = (SharedPtrStateBase *)operator_new(0x20);
        pSVar6->strongRefCount = 0;
        pSVar6->weakRefCount = 0;
        pSVar6->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021b1f18;
        pSVar6[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar5;
        pSVar6->strongRefCount = 1;
        pSVar6->weakRefCount = 1;
        local_88.m_state = pSVar6;
        pNVar4 = (Node *)operator_new(0x28);
        pNVar4->_vptr_Node = (_func_int **)&PTR__Node_021b1ef8;
        pNVar4->m_type = TYPE_VARIABLE;
        (pNVar4->m_enclosingNode).m_ptr = pNVar5;
        (pNVar4->m_enclosingNode).m_state = pSVar6;
        LOCK();
        pSVar6->strongRefCount = pSVar6->strongRefCount + 1;
        UNLOCK();
        LOCK();
        pdVar1 = &((pNVar4->m_enclosingNode).m_state)->weakRefCount;
        *pdVar1 = *pdVar1 + 1;
        UNLOCK();
        pNVar4->_vptr_Node = (_func_int **)&PTR__Node_021b2070;
        *(undefined4 *)&pNVar4[1]._vptr_Node = 4;
        local_68.m_state = (SharedPtrStateBase *)0x0;
        local_68.m_ptr = pNVar4;
        local_68.m_state = (SharedPtrStateBase *)operator_new(0x20);
        (local_68.m_state)->strongRefCount = 0;
        (local_68.m_state)->weakRefCount = 0;
        (local_68.m_state)->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021b1f18;
        local_68.m_state[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar4;
        (local_68.m_state)->strongRefCount = 1;
        (local_68.m_state)->weakRefCount = 1;
        (*local_38)(local_48,&local_68,local_40,PROGRAMINTERFACE_PROGRAM_INPUT,"patch_var_struct");
        if (local_68.m_state != (SharedPtrStateBase *)0x0) {
          LOCK();
          pdVar1 = &(local_68.m_state)->strongRefCount;
          *pdVar1 = *pdVar1 + -1;
          UNLOCK();
          if (*pdVar1 == 0) {
            local_68.m_ptr = (Node *)0x0;
            (*(local_68.m_state)->_vptr_SharedPtrStateBase[2])();
          }
          LOCK();
          pdVar1 = &(local_68.m_state)->weakRefCount;
          *pdVar1 = *pdVar1 + -1;
          UNLOCK();
          if (*pdVar1 == 0) {
            if (local_68.m_state != (SharedPtrStateBase *)0x0) {
              (*(local_68.m_state)->_vptr_SharedPtrStateBase[1])();
            }
            local_68.m_state = (SharedPtrStateBase *)0x0;
          }
        }
        if (local_88.m_state != (SharedPtrStateBase *)0x0) {
          LOCK();
          pdVar1 = &(local_88.m_state)->strongRefCount;
          *pdVar1 = *pdVar1 + -1;
          UNLOCK();
          if (*pdVar1 == 0) {
            local_88.m_ptr = (Node *)0x0;
            (*(local_88.m_state)->_vptr_SharedPtrStateBase[2])();
          }
          LOCK();
          pdVar1 = &(local_88.m_state)->weakRefCount;
          *pdVar1 = *pdVar1 + -1;
          UNLOCK();
          if (*pdVar1 == 0) {
            if (local_88.m_state != (SharedPtrStateBase *)0x0) {
              (*(local_88.m_state)->_vptr_SharedPtrStateBase[1])();
            }
            local_88.m_state = (SharedPtrStateBase *)0x0;
          }
        }
        pNVar5 = (Node *)operator_new(0x28);
        pNVar5->_vptr_Node = (_func_int **)&PTR__Node_021b1ef8;
        pNVar5->m_type = TYPE_ARRAY_ELEMENT;
        (pNVar5->m_enclosingNode).m_ptr = local_78.m_ptr;
        (pNVar5->m_enclosingNode).m_state = local_78.m_state;
        if (local_78.m_state != (SharedPtrStateBase *)0x0) {
          LOCK();
          (local_78.m_state)->strongRefCount = (local_78.m_state)->strongRefCount + 1;
          UNLOCK();
          LOCK();
          pdVar1 = &((pNVar5->m_enclosingNode).m_state)->weakRefCount;
          *pdVar1 = *pdVar1 + 1;
          UNLOCK();
        }
        pNVar5->_vptr_Node = (_func_int **)&PTR__Node_021b2038;
        *(undefined4 *)&pNVar5[1]._vptr_Node = 0xffffffff;
        local_88.m_state = (SharedPtrStateBase *)0x0;
        local_88.m_ptr = pNVar5;
        pSVar6 = (SharedPtrStateBase *)operator_new(0x20);
        pSVar6->strongRefCount = 0;
        pSVar6->weakRefCount = 0;
        pSVar6->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021b1f18;
        pSVar6[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar5;
        pSVar6->strongRefCount = 1;
        pSVar6->weakRefCount = 1;
        local_88.m_state = pSVar6;
        pNVar4 = (Node *)operator_new(0x28);
        pNVar4->_vptr_Node = (_func_int **)&PTR__Node_021b1ef8;
        pNVar4->m_type = TYPE_VARIABLE;
        (pNVar4->m_enclosingNode).m_ptr = pNVar5;
        (pNVar4->m_enclosingNode).m_state = pSVar6;
        LOCK();
        pSVar6->strongRefCount = pSVar6->strongRefCount + 1;
        UNLOCK();
        LOCK();
        pdVar1 = &((pNVar4->m_enclosingNode).m_state)->weakRefCount;
        *pdVar1 = *pdVar1 + 1;
        UNLOCK();
        pNVar4->_vptr_Node = (_func_int **)&PTR__Node_021b2070;
        *(undefined4 *)&pNVar4[1]._vptr_Node = 4;
        local_68.m_state = (SharedPtrStateBase *)0x0;
        local_68.m_ptr = pNVar4;
        local_68.m_state = (SharedPtrStateBase *)operator_new(0x20);
        (local_68.m_state)->strongRefCount = 0;
        (local_68.m_state)->weakRefCount = 0;
        (local_68.m_state)->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021b1f18;
        local_68.m_state[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar4;
        (local_68.m_state)->strongRefCount = 1;
        (local_68.m_state)->weakRefCount = 1;
        (*local_38)(local_48,&local_68,local_40,PROGRAMINTERFACE_PROGRAM_INPUT,"patch_var_array");
        if (local_68.m_state != (SharedPtrStateBase *)0x0) {
          LOCK();
          pdVar1 = &(local_68.m_state)->strongRefCount;
          *pdVar1 = *pdVar1 + -1;
          UNLOCK();
          if (*pdVar1 == 0) {
            local_68.m_ptr = (Node *)0x0;
            (*(local_68.m_state)->_vptr_SharedPtrStateBase[2])();
          }
          LOCK();
          pdVar1 = &(local_68.m_state)->weakRefCount;
          *pdVar1 = *pdVar1 + -1;
          UNLOCK();
          if (*pdVar1 == 0) {
            if (local_68.m_state != (SharedPtrStateBase *)0x0) {
              (*(local_68.m_state)->_vptr_SharedPtrStateBase[1])();
            }
            local_68.m_state = (SharedPtrStateBase *)0x0;
          }
        }
      }
      goto LAB_015a53b0;
    }
    pNVar5 = (Node *)operator_new(0x28);
    pNVar5->_vptr_Node = (_func_int **)&PTR__Node_021b1ef8;
    pNVar5->m_type = TYPE_VARIABLE;
    (pNVar5->m_enclosingNode).m_ptr = local_58;
    (pNVar5->m_enclosingNode).m_state = pSStack_50;
    if (pSStack_50 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pSStack_50->strongRefCount = pSStack_50->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar1 = &((pNVar5->m_enclosingNode).m_state)->weakRefCount;
      *pdVar1 = *pdVar1 + 1;
      UNLOCK();
    }
    pNVar5->_vptr_Node = (_func_int **)&PTR__Node_021b2070;
    *(undefined4 *)&pNVar5[1]._vptr_Node = 4;
    local_78.m_state = (SharedPtrStateBase *)0x0;
    local_78.m_ptr = pNVar5;
    local_78.m_state = (SharedPtrStateBase *)operator_new(0x20);
    (local_78.m_state)->strongRefCount = 0;
    (local_78.m_state)->weakRefCount = 0;
    (local_78.m_state)->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021b1f18;
    local_78.m_state[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar5;
    (local_78.m_state)->strongRefCount = 1;
    (local_78.m_state)->weakRefCount = 1;
    (*local_38)(local_48,&local_78,local_40,PROGRAMINTERFACE_PROGRAM_INPUT,"var");
  }
  if (local_78.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &(local_78.m_state)->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_78.m_ptr = (Node *)0x0;
      (*(local_78.m_state)->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar1 = &(local_78.m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      if (local_78.m_state != (SharedPtrStateBase *)0x0) {
        (*(local_78.m_state)->_vptr_SharedPtrStateBase[1])();
      }
      local_78.m_state = (SharedPtrStateBase *)0x0;
    }
  }
LAB_015a543f:
  if (pSStack_50 != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &pSStack_50->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_58 = (Node *)0x0;
      (*pSStack_50->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar1 = &pSStack_50->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if ((*pdVar1 == 0) && (pSStack_50 != (SharedPtrStateBase *)0x0)) {
      (*pSStack_50->_vptr_SharedPtrStateBase[1])();
    }
  }
  return;
}

Assistant:

static void generateProgramInputBlockContents (Context&										context,
											   const ResourceDefinition::Node::SharedPtr&	parentStructure,
											   tcu::TestCaseGroup*							targetGroup,
											   deUint32										presentShadersMask,
											   bool											includeEmpty,
											   void											(*genCase)(Context&										context,
																									   const ResourceDefinition::Node::SharedPtr&	parentStructure,
																									   tcu::TestCaseGroup*							targetGroup,
																									   ProgramInterface								interface,
																									   const char*									name))
{
	const bool									inDefaultBlock	= parentStructure->getType() == ResourceDefinition::Node::TYPE_DEFAULT_BLOCK;
	const ResourceDefinition::Node::SharedPtr	input			= (inDefaultBlock)
																	? (ResourceDefinition::Node::SharedPtr(new ResourceDefinition::StorageQualifier(parentStructure, glu::STORAGE_IN)))
																	: (parentStructure);
	const glu::ShaderType						firstStage		= getShaderMaskFirstStage(presentShadersMask);

	// .empty
	if (includeEmpty && inDefaultBlock)
		genCase(context, parentStructure, targetGroup, PROGRAMINTERFACE_PROGRAM_INPUT, "empty");

	if (firstStage == glu::SHADERTYPE_VERTEX)
	{
		// .var
		const ResourceDefinition::Node::SharedPtr variable(new ResourceDefinition::Variable(input, glu::TYPE_FLOAT_VEC4));
		genCase(context, variable, targetGroup, PROGRAMINTERFACE_PROGRAM_INPUT, "var");
	}
	else if (firstStage == glu::SHADERTYPE_FRAGMENT || !inDefaultBlock)
	{
		// .var
		{
			const ResourceDefinition::Node::SharedPtr variable(new ResourceDefinition::Variable(input, glu::TYPE_FLOAT_VEC4));
			genCase(context, variable, targetGroup, PROGRAMINTERFACE_PROGRAM_INPUT, "var");
		}
		// .var_struct
		{
			const ResourceDefinition::Node::SharedPtr structMbr	(new ResourceDefinition::StructMember(input));
			const ResourceDefinition::Node::SharedPtr variable	(new ResourceDefinition::Variable(structMbr, glu::TYPE_FLOAT_VEC4));
			genCase(context, variable, targetGroup, PROGRAMINTERFACE_PROGRAM_INPUT, "var_struct");
		}
		// .var_array
		{
			const ResourceDefinition::Node::SharedPtr arrayElem	(new ResourceDefinition::ArrayElement(input));
			const ResourceDefinition::Node::SharedPtr variable	(new ResourceDefinition::Variable(arrayElem, glu::TYPE_FLOAT_VEC4));
			genCase(context, variable, targetGroup, PROGRAMINTERFACE_PROGRAM_INPUT, "var_array");
		}
	}
	else if (firstStage == glu::SHADERTYPE_TESSELLATION_CONTROL ||
			 firstStage == glu::SHADERTYPE_GEOMETRY)
	{
		// arrayed interface

		// .var
		{
			const ResourceDefinition::Node::SharedPtr arrayElem	(new ResourceDefinition::ArrayElement(input, ResourceDefinition::ArrayElement::UNSIZED_ARRAY));
			const ResourceDefinition::Node::SharedPtr variable	(new ResourceDefinition::Variable(arrayElem, glu::TYPE_FLOAT_VEC4));
			genCase(context, variable, targetGroup, PROGRAMINTERFACE_PROGRAM_INPUT, "var");
		}
		// extension forbids use arrays of structs
		// extension forbids use arrays of arrays
	}
	else if (firstStage == glu::SHADERTYPE_TESSELLATION_EVALUATION)
	{
		// arrayed interface
		const ResourceDefinition::Node::SharedPtr patchInput(new ResourceDefinition::StorageQualifier(parentStructure, glu::STORAGE_PATCH_IN));

		// .var
		{
			const ResourceDefinition::Node::SharedPtr arrayElem	(new ResourceDefinition::ArrayElement(input, ResourceDefinition::ArrayElement::UNSIZED_ARRAY));
			const ResourceDefinition::Node::SharedPtr variable	(new ResourceDefinition::Variable(arrayElem, glu::TYPE_FLOAT_VEC4));
			genCase(context, variable, targetGroup, PROGRAMINTERFACE_PROGRAM_INPUT, "var");
		}
		// extension forbids use arrays of structs
		// extension forbids use arrays of arrays

		// .patch_var
		{
			const ResourceDefinition::Node::SharedPtr variable	(new ResourceDefinition::Variable(patchInput, glu::TYPE_FLOAT_VEC4));
			genCase(context, variable, targetGroup, PROGRAMINTERFACE_PROGRAM_INPUT, "patch_var");
		}
		// .patch_var_struct
		{
			const ResourceDefinition::Node::SharedPtr structMbr	(new ResourceDefinition::StructMember(patchInput));
			const ResourceDefinition::Node::SharedPtr variable	(new ResourceDefinition::Variable(structMbr, glu::TYPE_FLOAT_VEC4));
			genCase(context, variable, targetGroup, PROGRAMINTERFACE_PROGRAM_INPUT, "patch_var_struct");
		}
		// .patch_var_array
		{
			const ResourceDefinition::Node::SharedPtr arrayElem	(new ResourceDefinition::ArrayElement(patchInput));
			const ResourceDefinition::Node::SharedPtr variable	(new ResourceDefinition::Variable(arrayElem, glu::TYPE_FLOAT_VEC4));
			genCase(context, variable, targetGroup, PROGRAMINTERFACE_PROGRAM_INPUT, "patch_var_array");
		}
	}
	else if (firstStage == glu::SHADERTYPE_COMPUTE)
	{
		// nada
	}
	else
		DE_ASSERT(false);
}